

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O2

timer_id_t __thiscall
so_5::timers_details::
actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::schedule(actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,type_index *type_index,mbox_t *mbox,message_ref_t *msg,duration pause,
          duration period)

{
  basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
  *this_00;
  intrusive_ptr_t<so_5::timer_t> iVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_00000008;
  actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *local_90;
  timer_holder local_88;
  anon_class_32_4_6b32a2d3 local_80;
  intrusive_ptr_t<so_5::timer_t> local_60;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  timer_action local_50;
  
  local_80.this =
       (actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
        *)type_index[1]._M_target;
  local_60.m_obj = (timer_t *)this;
  local_58.__r = period.__r;
  stdcpp::
  make_unique<so_5::timers_details::actual_timer_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>,timertt::timer_list_manager_template<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>*>
            ((stdcpp *)&local_90,
             (timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              **)&local_80);
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
             *)type_index[1]._M_target;
  local_88.m_timer =
       (timer_object<timertt::thread_safety::unsafe> *)
       local_90[1].super_timer_manager_t._vptr_timer_manager_t;
  if (local_88.m_timer != (timer_object<timertt::thread_safety::unsafe> *)0x0) {
    (local_88.m_timer)->m_references = (local_88.m_timer)->m_references + 1;
  }
  local_80.type_index._M_target = (type_info *)mbox->m_obj;
  local_80.mbox.m_obj = (abstract_message_box_t *)msg->m_obj;
  if ((message_t *)local_80.mbox.m_obj != (message_t *)0x0) {
    LOCK();
    (((message_t *)local_80.mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         (((message_t *)local_80.mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  local_80.msg.m_obj = *(message_t **)pause.__r;
  if (local_80.msg.m_obj != (message_t *)0x0) {
    LOCK();
    ((local_80.msg.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         ((local_80.msg.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  local_80.this =
       (actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
        *)type_index;
  std::function<void()>::
  function<so_5::timers_details::actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>::schedule(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_,void>
            ((function<void()> *)&local_50,&local_80);
  timertt::details::
  basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
  ::
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this_00,&local_88,local_58,in_stack_00000008,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
  ::
  schedule(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)
  ::{lambda()#1}::~duration((_lambda___1_ *)&local_80);
  timertt::timer_object_holder<timertt::thread_safety::unsafe>::dismiss_object(&local_88);
  iVar1.m_obj = local_60.m_obj;
  local_80.this = local_90;
  local_90 = (actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
              *)0x0;
  if (local_80.this !=
      (actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
       *)0x0) {
    LOCK();
    ((local_80.this)->m_manager)._M_t.
    super___uniq_ptr_impl<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_*,_std::default_delete<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
    .
    super__Head_base<0UL,_timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_*,_false>
    ._M_head_impl =
         (timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
          *)((long)&((((local_80.this)->m_manager)._M_t.
                      super___uniq_ptr_impl<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_*,_std::default_delete<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
                      .
                      super__Head_base<0UL,_timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_*,_false>
                     ._M_head_impl)->
                    super_manager_impl_template<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
                    ).
                    super_basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
            + 1);
    UNLOCK();
  }
  timer_id_t::timer_id_t((timer_id_t *)local_60.m_obj,(intrusive_ptr_t<so_5::timer_t> *)&local_80);
  intrusive_ptr_t<so_5::timer_t>::~intrusive_ptr_t((intrusive_ptr_t<so_5::timer_t> *)&local_80);
  if (local_90 !=
      (actual_manager_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
       *)0x0) {
    (**(code **)(*(long *)local_90 + 8))();
  }
  return (timer_id_t)(intrusive_ptr_t<so_5::timer_t>)iVar1.m_obj;
}

Assistant:

virtual timer_id_t
		schedule(
			const std::type_index & type_index,
			const mbox_t & mbox,
			const message_ref_t & msg,
			std::chrono::steady_clock::duration pause,
			std::chrono::steady_clock::duration period ) override
			{
				auto timer = stdcpp::make_unique< timer_demand_t >( m_manager.get() );

				m_manager->activate( timer->timer_holder(),
						pause,
						period,
						[this, type_index, mbox, msg]()
						{
							m_collector.get().accept( type_index, mbox, msg );
						} );

				return timer_id_t( timer.release() );
			}